

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStreamComponent_RegisterChannels
                  (PaAlsaStreamComponent *self,PaUtilBufferProcessor *bp,unsigned_long *numFrames,
                  int *xrun)

{
  uint uVar1;
  snd_pcm_t *psVar2;
  undefined8 uVar3;
  unsigned_long uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  PaError PVar11;
  void *pvVar12;
  ulong uVar13;
  int *piVar14;
  code *pcVar15;
  undefined8 uStack_60;
  unsigned_long local_58;
  unsigned_long framesAvail;
  int *local_48;
  snd_pcm_channel_area_t *local_40;
  snd_pcm_channel_area_t *areas;
  
  if (self->streamDir == StreamDirection_In) {
    pcVar15 = PaUtil_SetInputChannel;
  }
  else {
    pcVar15 = PaUtil_SetOutputChannel;
  }
  uStack_60 = 0x11332f;
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                         ((PaAlsaStreamComponent *)self->pcm,&local_58,xrun);
  if (paUtilErr_ < 0) {
    uStack_60 = 0x1135b7;
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_GetAvailableFrames( self, &framesAvail, xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3969\n"
                     );
    PVar11 = paUtilErr_;
  }
  else if (*xrun == 0) {
    if (self->canMmap == 0) {
      iVar5 = self->numHostChannels;
      uStack_60 = 0x113399;
      areas = (snd_pcm_channel_area_t *)pcVar15;
      iVar6 = snd_pcm_format_size(self->nativeFormat,*numFrames);
      pcVar15 = (code *)areas;
      uVar7 = iVar6 * iVar5;
      if (self->nonMmapBufferSize < uVar7) {
        self->nonMmapBufferSize = uVar7;
        uStack_60 = 0x1133b8;
        pvVar12 = realloc(self->nonMmapBuffer,(ulong)uVar7);
        self->nonMmapBuffer = pvVar12;
        if (pvVar12 == (void *)0x0) {
          return -0x2708;
        }
      }
    }
    else {
      uStack_60 = 0x11336f;
      iVar5 = snd_pcm_mmap_begin(self->pcm,&local_40,&self->offset,numFrames);
      if (iVar5 < 0) {
        uStack_60 = 0x1135c7;
        PaAlsaStreamComponent_RegisterChannels_cold_1();
        return -9999;
      }
      self->channelAreas = local_40;
    }
    framesAvail = (unsigned_long)numFrames;
    local_48 = xrun;
    if (self->hostInterleaved == 0) {
      if (self->canMmap == 0) {
        if (0 < self->numUserChannels) {
          pvVar12 = self->nonMmapBuffer;
          iVar5 = 0;
          areas = (snd_pcm_channel_area_t *)
                  ((ulong)self->nonMmapBufferSize / (ulong)(uint)self->numHostChannels);
          do {
            uStack_60 = 0x11350e;
            (*pcVar15)(bp,iVar5,pvVar12,1);
            pvVar12 = (void *)((long)pvVar12 + (long)areas);
            iVar5 = iVar5 + 1;
          } while (iVar5 < self->numUserChannels);
        }
      }
      else if (0 < self->numUserChannels) {
        lVar8 = 0xc;
        uVar13 = 0;
        do {
          uStack_60 = 0x11345d;
          (*pcVar15)(bp,uVar13 & 0xffffffff,
                     ((ulong)*(uint *)((long)&local_40->addr + lVar8) * self->offset +
                      (ulong)*(uint *)((long)local_40 + lVar8 + -4) >> 3) +
                     *(long *)((long)local_40 + lVar8 + -0xc),1);
          uVar13 = uVar13 + 1;
          lVar8 = lVar8 + 0x10;
        } while ((long)uVar13 < (long)self->numUserChannels);
      }
    }
    else {
      uStack_60 = 0x1133e2;
      iVar5 = snd_pcm_format_size(self->nativeFormat,1);
      if (self->canMmap == 0) {
        pvVar12 = self->nonMmapBuffer;
      }
      else {
        pvVar12 = (void *)(((ulong)local_40->step * self->offset + (ulong)local_40->first >> 3) +
                          (long)local_40->addr);
      }
      if (0 < self->numUserChannels) {
        areas = (snd_pcm_channel_area_t *)(long)iVar5;
        iVar5 = 0;
        do {
          uStack_60 = 0x113497;
          (*pcVar15)(bp,iVar5,pvVar12,self->numHostChannels);
          pvVar12 = (void *)((long)pvVar12 + (long)areas);
          iVar5 = iVar5 + 1;
        } while (iVar5 < self->numUserChannels);
      }
    }
    piVar14 = local_48;
    uVar4 = framesAvail;
    PVar11 = 0;
    if ((self->canMmap == 0) && (self->streamDir == StreamDirection_In)) {
      if (self->hostInterleaved == 0) {
        lVar8 = -((ulong)(uint)self->numHostChannels * 8 + 0xf & 0xfffffffffffffff0);
        lVar9 = (long)&local_58 + lVar8;
        uVar7 = self->numHostChannels;
        if (0 < (long)(int)uVar7) {
          pvVar12 = self->nonMmapBuffer;
          uVar1 = self->nonMmapBufferSize;
          lVar10 = 0;
          do {
            *(void **)(lVar9 + lVar10 * 8) = pvVar12;
            pvVar12 = (void *)((long)pvVar12 + (ulong)uVar1 / (ulong)uVar7);
            lVar10 = lVar10 + 1;
          } while ((int)uVar7 != lVar10);
        }
        psVar2 = self->pcm;
        uVar3 = *(undefined8 *)uVar4;
        *(undefined8 *)((long)&uStack_60 + lVar8) = 0x11357b;
        iVar5 = snd_pcm_readn(psVar2,lVar9,uVar3);
      }
      else {
        uStack_60 = 0x1134d7;
        iVar5 = snd_pcm_readi(self->pcm,self->nonMmapBuffer,*(undefined8 *)framesAvail);
        piVar14 = local_48;
      }
      if ((iVar5 == -0x20) || (iVar5 == -0x56)) {
        *piVar14 = 1;
        *(undefined8 *)uVar4 = 0;
      }
    }
  }
  else {
    *numFrames = 0;
    PVar11 = 0;
  }
  return PVar11;
}

Assistant:

static PaError PaAlsaStreamComponent_RegisterChannels( PaAlsaStreamComponent* self, PaUtilBufferProcessor* bp,
        unsigned long* numFrames, int* xrun )
{
    PaError result = paNoError;
    const snd_pcm_channel_area_t *areas, *area;
    void (*setChannel)(PaUtilBufferProcessor *, unsigned int, void *, unsigned int) =
        StreamDirection_In == self->streamDir ? PaUtil_SetInputChannel : PaUtil_SetOutputChannel;
    unsigned char *buffer, *p;
    int i;
    unsigned long framesAvail;

    /* This _must_ be called before mmap_begin */
    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( self, &framesAvail, xrun ) );
    if( *xrun )
    {
        *numFrames = 0;
        goto end;
    }

    if( self->canMmap )
    {
        ENSURE_( alsa_snd_pcm_mmap_begin( self->pcm, &areas, &self->offset, numFrames ), paUnanticipatedHostError );
        /* @concern ChannelAdaption Buffer address is recorded so we can do some channel adaption later */
        self->channelAreas = (snd_pcm_channel_area_t *)areas;
    }
    else
    {
        unsigned int bufferSize = self->numHostChannels * alsa_snd_pcm_format_size( self->nativeFormat, *numFrames );
        if( bufferSize > self->nonMmapBufferSize )
        {
            self->nonMmapBuffer = realloc( self->nonMmapBuffer, ( self->nonMmapBufferSize = bufferSize ) );
            if( !self->nonMmapBuffer )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }
    }

    if( self->hostInterleaved )
    {
        int swidth = alsa_snd_pcm_format_size( self->nativeFormat, 1 );

        p = buffer = self->canMmap ? ExtractAddress( areas, self->offset ) : self->nonMmapBuffer;
        for( i = 0; i < self->numUserChannels; ++i )
        {
            /* We're setting the channels up to userChannels, but the stride will be hostChannels samples */
            setChannel( bp, i, p, self->numHostChannels );
            p += swidth;
        }
    }
    else
    {
        if( self->canMmap )
        {
            for( i = 0; i < self->numUserChannels; ++i )
            {
                area = areas + i;
                buffer = ExtractAddress( area, self->offset );
                setChannel( bp, i, buffer, 1 );
            }
        }
        else
        {
            unsigned int buf_per_ch_size = self->nonMmapBufferSize / self->numHostChannels;
            buffer = self->nonMmapBuffer;
            for( i = 0; i < self->numUserChannels; ++i )
            {
                setChannel( bp, i, buffer, 1 );
                buffer += buf_per_ch_size;
            }
        }
    }

    if( !self->canMmap && StreamDirection_In == self->streamDir )
    {
        /* Read sound */
        int res;
        if( self->hostInterleaved )
            res = alsa_snd_pcm_readi( self->pcm, self->nonMmapBuffer, *numFrames );
        else
        {
            void *bufs[self->numHostChannels];
            unsigned int buf_per_ch_size = self->nonMmapBufferSize / self->numHostChannels;
            unsigned char *buffer = self->nonMmapBuffer;
            int i;
            for( i = 0; i < self->numHostChannels; ++i )
            {
                bufs[i] = buffer;
                buffer += buf_per_ch_size;
            }
            res = alsa_snd_pcm_readn( self->pcm, bufs, *numFrames );
        }
        if( res == -EPIPE || res == -ESTRPIPE )
        {
            *xrun = 1;
            *numFrames = 0;
        }
    }

end:
error:
    return result;
}